

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

void __thiscall
dg::dda::MemorySSATransformation::collectAllDefinitionsInCallers
          (MemorySSATransformation *this,Definitions *defs,RWSubgraph *subg)

{
  bool bVar1;
  RWNodeCall *this_00;
  RWNode *pRVar2;
  reference pvVar3;
  RWSubgraph *in_RDX;
  RWNodeCall *in_RDI;
  pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>
  *it2;
  const_iterator __end4;
  const_iterator __begin4;
  DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *__range4;
  value_type *it;
  const_iterator __end3;
  const_iterator __begin3;
  DefinitionsMap<dg::dda::RWNode> *__range3;
  Definitions tmpDefs;
  RWNode *callphi;
  RWNodeCall *C;
  RWNode *callsite;
  iterator __end2;
  iterator __begin2;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *__range2;
  RWNode *phi;
  DefSite ds;
  Summary *summary;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *callers;
  bool in_stack_0000016f;
  Definitions *in_stack_00000170;
  RWNode *in_stack_00000178;
  MemorySSATransformation *in_stack_00000180;
  RWSubgraph *in_stack_fffffffffffffe98;
  RWNode *t;
  value_type *in_stack_fffffffffffffea8;
  const_iterator in_stack_fffffffffffffeb0;
  const_iterator in_stack_fffffffffffffeb8;
  MemorySSATransformation *in_stack_fffffffffffffec0;
  _Node_iterator_base<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>
  local_130;
  _Node_iterator_base<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>
  local_128;
  undefined1 *local_120;
  undefined1 auStack_110 [24];
  Summary *in_stack_ffffffffffffff08;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  local_68;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *local_60;
  RWNode *local_58;
  Offset local_50;
  Offset local_48;
  GenericDefSite<dg::dda::RWNode> local_40;
  Summary *local_28;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *local_20;
  RWSubgraph *local_18;
  
  local_18 = in_RDX;
  local_20 = RWSubgraph::getCallers(in_RDX);
  bVar1 = std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::empty
                    ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                     in_stack_fffffffffffffeb0._M_node);
  if (!bVar1) {
    local_28 = getSubgraphSummary((MemorySSATransformation *)in_RDI,in_stack_fffffffffffffe98);
    t = (RWNode *)UNKNOWN_MEMORY;
    Offset::Offset(&local_48,Offset::UNKNOWN);
    Offset::Offset(&local_50,Offset::UNKNOWN);
    GenericDefSite<dg::dda::RWNode>::GenericDefSite(&local_40,t,&local_48,&local_50);
    local_58 = SubgraphInfo::Summary::getUnknownPhi(in_stack_ffffffffffffff08);
    if (local_58 == (RWNode *)0x0) {
      local_58 = createPhi(in_stack_fffffffffffffec0,(DefSite *)in_stack_fffffffffffffeb8._M_node,
                           (RWNodeType)((ulong)in_stack_fffffffffffffeb0._M_node >> 0x20));
      SubgraphInfo::Summary::addInput((Summary *)in_RDI,(DefSite *)t,(RWNode *)0x17572c);
    }
    std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::push_back
              ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
               in_stack_fffffffffffffeb0._M_node,in_stack_fffffffffffffea8);
    local_60 = RWSubgraph::getCallers(local_18);
    local_68._M_current =
         (RWNode **)
         std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin
                   ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)t);
    std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
              ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)t);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                               *)in_RDI,
                              (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                               *)t), bVar1) {
      __gnu_cxx::
      __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
      ::operator*(&local_68);
      this_00 = RWNodeCall::get(&in_RDI->super_RWNode);
      pRVar2 = RWNodeCall::getUnknownPhi(this_00);
      if (pRVar2 == (RWNode *)0x0) {
        createPhi(in_stack_fffffffffffffec0,(DefSite *)in_stack_fffffffffffffeb8._M_node,
                  (RWNodeType)((ulong)in_stack_fffffffffffffeb0._M_node >> 0x20));
        RWNodeCall::addUnknownInput(in_RDI,t);
        RWNode::addDefUse(&in_RDI->super_RWNode,t);
        Definitions::Definitions((Definitions *)in_RDI);
        collectAllDefinitions
                  (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_0000016f);
        local_120 = auStack_110;
        local_128._M_cur =
             (__node_type *)
             DefinitionsMap<dg::dda::RWNode>::begin((DefinitionsMap<dg::dda::RWNode> *)t);
        local_130._M_cur =
             (__node_type *)
             DefinitionsMap<dg::dda::RWNode>::end((DefinitionsMap<dg::dda::RWNode> *)t);
        while (bVar1 = std::__detail::operator!=(&local_128,&local_130), bVar1) {
          pvVar3 = std::__detail::
                   _Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
                   ::operator*((_Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
                                *)0x1758c6);
          in_stack_fffffffffffffec0 = (MemorySSATransformation *)&pvVar3->second;
          in_stack_fffffffffffffeb8 =
               ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::begin
                         ((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)t);
          in_stack_fffffffffffffeb0 =
               ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::end
                         ((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)t);
          while (bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffeb8,
                                         (_Self *)&stack0xfffffffffffffeb0), bVar1) {
            std::
            _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
            ::operator*((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                         *)0x175916);
            RWNode::
            addDefUse<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
                      (&in_RDI->super_RWNode,
                       (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                        *)t);
            std::
            _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
            ::operator++((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                          *)in_RDI);
          }
          std::__detail::
          _Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
          ::operator++((_Node_const_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
                        *)in_RDI);
        }
        RWNode::addDefUse<std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
                  (&in_RDI->super_RWNode,
                   (vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)t);
        Definitions::~Definitions((Definitions *)in_RDI);
      }
      else {
        RWNode::addDefUse(&in_RDI->super_RWNode,t);
      }
      __gnu_cxx::
      __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
      ::operator++(&local_68);
    }
  }
  return;
}

Assistant:

void MemorySSATransformation::collectAllDefinitionsInCallers(Definitions &defs,
                                                             RWSubgraph *subg) {
    auto &callers = subg->getCallers();
    if (callers.empty()) {
        return;
    }

    // create an input PHI node
    auto &summary = getSubgraphSummary(subg);
    DefSite ds{UNKNOWN_MEMORY};
    RWNode *phi = summary.getUnknownPhi();
    if (!phi) {
        phi = createPhi(ds, /* type = */ RWNodeType::INARG);
        summary.addInput(ds, phi);
    }

    defs.unknownWrites.push_back(phi);

    for (auto *callsite : subg->getCallers()) {
        // create input PHI for this call
        auto *C = RWNodeCall::get(callsite);
        auto *callphi = C->getUnknownPhi();
        if (callphi) {
            phi->addDefUse(callphi);
            continue;
        }

        callphi = createPhi(ds, RWNodeType::CALLIN);
        C->addUnknownInput(callphi);
        phi->addDefUse(callphi);

        // NOTE: search _all_ definitions, not only those that are
        // not covered by 'defs'. Therefore, we can reuse this search
        // in all later searches.
        // auto tmpDefs = defs;
        Definitions tmpDefs;
        collectAllDefinitions(callsite, tmpDefs, /* escaping = */ true);
        for (const auto &it : tmpDefs.definitions) {
            for (const auto &it2 : it.second) {
                callphi->addDefUse(it2.second);
            }
        }
        callphi->addDefUse(tmpDefs.unknownWrites);
    }
}